

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

iterator * __thiscall
tcb::unicode::detail::
unicode_view<std::istreambuf_iterator<char32_t,_std::char_traits<char32_t>_>,_std::istreambuf_iterator<char32_t,_std::char_traits<char32_t>_>,_char32_t,_char32_t>
::iterator::operator++(iterator *this)

{
  streambuf_type *current;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  code_point u;
  encoded_chars<char32_t> eVar4;
  istreambuf_iterator<char32_t,_std::char_traits<char32_t>_> last;
  char32_t c;
  iterator *this_local;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  uVar3 = encoded_chars<char32_t>::size(&this->next_chars_);
  if ((bVar1 == uVar3) && (bVar2 = std::operator!=(&this->first_,&this->last_), bVar2)) {
    current = (this->last_)._M_sbuf;
    last._M_sbuf = (streambuf_type *)(*(ulong *)&(this->last_)._M_c & 0xffffffff);
    last._8_8_ = current;
    u = utf_traits<char32_t,4>::
        decode<std::istreambuf_iterator<char32_t,std::char_traits<char32_t>>,std::istreambuf_iterator<char32_t,std::char_traits<char32_t>>>
                  ((utf_traits<char32_t,4> *)&this->first_,
                   (istreambuf_iterator<char32_t,_std::char_traits<char32_t>_> *)current,last);
    eVar4 = utf_traits<char32_t,_4>::encode(u);
    this->next_chars_ = eVar4;
    this->idx_ = '\0';
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }